

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O0

REF_STATUS ref_fixture_twod_cubic_edge(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID pRVar1;
  REF_NODE ref_node_00;
  uint uVar2;
  long local_368;
  REF_INT local_358;
  long local_350;
  long local_330;
  long local_300;
  REF_INT local_2f0;
  long local_2e8;
  long local_2c8;
  long local_298;
  REF_INT local_288;
  long local_280;
  long local_260;
  long local_230;
  REF_INT local_220;
  long local_218;
  long local_1f8;
  int local_1d4;
  int local_1a8;
  int local_17c;
  int local_150;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nnodesg;
  REF_INT cell;
  REF_INT local [27];
  REF_INT global [27];
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  uVar2 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x231
           ,"ref_fixture_twod_cubic_edge",(ulong)uVar2,"create");
    return uVar2;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node_00 = pRVar1->node;
  pRVar1->twod = 1;
  local[0x1a] = 0;
  if (0 / ((ref_mpi->n + 3) / ref_mpi->n) < 4 - ref_mpi->n * (3 / ref_mpi->n)) {
    local_150 = 0 / ((ref_mpi->n + 3) / ref_mpi->n);
  }
  else {
    local_150 = -((4 - ref_mpi->n * (3 / ref_mpi->n)) * ((ref_mpi->n + 3) / ref_mpi->n)) /
                (3 / ref_mpi->n) + (4 - ref_mpi->n * (3 / ref_mpi->n));
  }
  if (ref_mpi->id != local_150) {
    if (2 / ((ref_mpi->n + 3) / ref_mpi->n) < 4 - ref_mpi->n * (3 / ref_mpi->n)) {
      local_17c = 2 / ((ref_mpi->n + 3) / ref_mpi->n);
    }
    else {
      local_17c = (2 - (4 - ref_mpi->n * (3 / ref_mpi->n)) * ((ref_mpi->n + 3) / ref_mpi->n)) /
                  (3 / ref_mpi->n) + (4 - ref_mpi->n * (3 / ref_mpi->n));
    }
    if (ref_mpi->id != local_17c) {
      if (3 / ((ref_mpi->n + 3) / ref_mpi->n) < 4 - ref_mpi->n * (3 / ref_mpi->n)) {
        local_1a8 = 3 / ((ref_mpi->n + 3) / ref_mpi->n);
      }
      else {
        local_1a8 = (3 - (4 - ref_mpi->n * (3 / ref_mpi->n)) * ((ref_mpi->n + 3) / ref_mpi->n)) /
                    (3 / ref_mpi->n) + (4 - ref_mpi->n * (3 / ref_mpi->n));
      }
      if (ref_mpi->id != local_1a8) {
        if (1 / ((ref_mpi->n + 3) / ref_mpi->n) < 4 - ref_mpi->n * (3 / ref_mpi->n)) {
          local_1d4 = 1 / ((ref_mpi->n + 3) / ref_mpi->n);
        }
        else {
          local_1d4 = (1 - (4 - ref_mpi->n * (3 / ref_mpi->n)) * ((ref_mpi->n + 3) / ref_mpi->n)) /
                      (3 / ref_mpi->n) + (4 - ref_mpi->n * (3 / ref_mpi->n));
        }
        if (ref_mpi->id != local_1d4) goto LAB_00159d14;
      }
    }
  }
  uVar2 = ref_node_add(ref_node_00,0,&nnodesg);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x244
           ,"ref_fixture_twod_cubic_edge",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[nnodesg * 0xf] = 0.0;
  ref_node_00->real[nnodesg * 0xf + 1] = 0.0;
  ref_node_00->real[nnodesg * 0xf + 2] = 0.0;
  if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
    local_1f8 = -1;
  }
  else {
    local_1f8 = ref_node_00->global[nnodesg];
  }
  if (local_1f8 / (long)((ref_mpi->n + 3) / ref_mpi->n) < (long)(4 - ref_mpi->n * (3 / ref_mpi->n)))
  {
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_218 = -1;
    }
    else {
      local_218 = ref_node_00->global[nnodesg];
    }
    local_220 = (REF_INT)(local_218 / (long)((ref_mpi->n + 3) / ref_mpi->n));
  }
  else {
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_230 = -1;
    }
    else {
      local_230 = ref_node_00->global[nnodesg];
    }
    local_220 = (int)((local_230 -
                      (4 - ref_mpi->n * (3 / ref_mpi->n)) * ((ref_mpi->n + 3) / ref_mpi->n)) /
                     (long)(3 / ref_mpi->n)) + (4 - ref_mpi->n * (3 / ref_mpi->n));
  }
  ref_node_00->part[nnodesg] = local_220;
  uVar2 = ref_node_add(ref_node_00,2,&cell);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x245
           ,"ref_fixture_twod_cubic_edge",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[cell * 0xf] = 1.0;
  ref_node_00->real[cell * 0xf + 1] = 0.0;
  ref_node_00->real[cell * 0xf + 2] = 0.0;
  if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
    local_260 = -1;
  }
  else {
    local_260 = ref_node_00->global[cell];
  }
  if (local_260 / (long)((ref_mpi->n + 3) / ref_mpi->n) < (long)(4 - ref_mpi->n * (3 / ref_mpi->n)))
  {
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_280 = -1;
    }
    else {
      local_280 = ref_node_00->global[cell];
    }
    local_288 = (REF_INT)(local_280 / (long)((ref_mpi->n + 3) / ref_mpi->n));
  }
  else {
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_298 = -1;
    }
    else {
      local_298 = ref_node_00->global[cell];
    }
    local_288 = (int)((local_298 -
                      (4 - ref_mpi->n * (3 / ref_mpi->n)) * ((ref_mpi->n + 3) / ref_mpi->n)) /
                     (long)(3 / ref_mpi->n)) + (4 - ref_mpi->n * (3 / ref_mpi->n));
  }
  ref_node_00->part[cell] = local_288;
  uVar2 = ref_node_add(ref_node_00,3,local);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x246
           ,"ref_fixture_twod_cubic_edge",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[local[0] * 0xf] = 0.3333333333333333;
  ref_node_00->real[local[0] * 0xf + 1] = 0.0;
  ref_node_00->real[local[0] * 0xf + 2] = 0.0;
  if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
    local_2c8 = -1;
  }
  else {
    local_2c8 = ref_node_00->global[local[0]];
  }
  if (local_2c8 / (long)((ref_mpi->n + 3) / ref_mpi->n) < (long)(4 - ref_mpi->n * (3 / ref_mpi->n)))
  {
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_2e8 = -1;
    }
    else {
      local_2e8 = ref_node_00->global[local[0]];
    }
    local_2f0 = (REF_INT)(local_2e8 / (long)((ref_mpi->n + 3) / ref_mpi->n));
  }
  else {
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_300 = -1;
    }
    else {
      local_300 = ref_node_00->global[local[0]];
    }
    local_2f0 = (int)((local_300 -
                      (4 - ref_mpi->n * (3 / ref_mpi->n)) * ((ref_mpi->n + 3) / ref_mpi->n)) /
                     (long)(3 / ref_mpi->n)) + (4 - ref_mpi->n * (3 / ref_mpi->n));
  }
  ref_node_00->part[local[0]] = local_2f0;
  uVar2 = ref_node_add(ref_node_00,1,local + 1);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x247
           ,"ref_fixture_twod_cubic_edge",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[local[1] * 0xf] = 0.6666666666666666;
  ref_node_00->real[local[1] * 0xf + 1] = 0.0;
  ref_node_00->real[local[1] * 0xf + 2] = 0.0;
  if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
    local_330 = -1;
  }
  else {
    local_330 = ref_node_00->global[local[1]];
  }
  if (local_330 / (long)((ref_mpi->n + 3) / ref_mpi->n) < (long)(4 - ref_mpi->n * (3 / ref_mpi->n)))
  {
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_350 = -1;
    }
    else {
      local_350 = ref_node_00->global[local[1]];
    }
    local_358 = (REF_INT)(local_350 / (long)((ref_mpi->n + 3) / ref_mpi->n));
  }
  else {
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_368 = -1;
    }
    else {
      local_368 = ref_node_00->global[local[1]];
    }
    local_358 = (int)((local_368 -
                      (4 - ref_mpi->n * (3 / ref_mpi->n)) * ((ref_mpi->n + 3) / ref_mpi->n)) /
                     (long)(3 / ref_mpi->n)) + (4 - ref_mpi->n * (3 / ref_mpi->n));
  }
  ref_node_00->part[local[1]] = local_358;
  uVar2 = ref_cell_add(pRVar1->cell[2],&nnodesg,&ref_private_macro_code_rss);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x249
           ,"ref_fixture_twod_cubic_edge",(ulong)uVar2,"add tri");
    return uVar2;
  }
LAB_00159d14:
  ref_grid_ptr_local._4_4_ = ref_node_initialize_n_global(ref_node_00,4);
  if (ref_grid_ptr_local._4_4_ == 0) {
    ref_grid_ptr_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x24c
           ,"ref_fixture_twod_cubic_edge",(ulong)ref_grid_ptr_local._4_4_,"init glob");
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_twod_cubic_edge(REF_GRID *ref_grid_ptr,
                                               REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnodesg = 4;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  global[0] = 0;
  global[1] = 2;
  global[2] = 3;
  global[3] = 1;
  global[4] = 30;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 1.0, 0.0, 0.0);
    add_that_node(2, 1.0 / 3.0, 0.0, 0.0);
    add_that_node(3, 2.0 / 3.0, 0.0, 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  return REF_SUCCESS;
}